

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswLcorr.c
# Opt level: O1

int Ssw_ManSweepLatch(Ssw_Man_t *p)

{
  void *pvVar1;
  Aig_Obj_t **ppAVar2;
  int iVar3;
  int iVar4;
  Aig_Man_t *pAVar5;
  Aig_Obj_t *pAVar6;
  void **ppvVar7;
  void **ppvVar8;
  Vec_Ptr_t *pVVar9;
  Aig_Obj_t *pAVar10;
  Ssw_Sat_t *pSVar11;
  uint uVar12;
  void **ppvVar13;
  int iVar14;
  long lVar15;
  
  pAVar5 = Aig_ManStart(p->pAig->vObjs->nSize);
  p->pFrames = pAVar5;
  p->pNodeToFrames[(long)p->pAig->pConst1->Id * (long)p->nFrames] = pAVar5->pConst1;
  pAVar5 = p->pAig;
  if (0 < pAVar5->nTruePis) {
    lVar15 = 0;
    do {
      if (pAVar5->vCis->nSize <= lVar15) goto LAB_006a7abf;
      pvVar1 = pAVar5->vCis->pArray[lVar15];
      pAVar6 = Aig_ObjCreateCi(p->pFrames);
      p->pNodeToFrames[(long)*(int *)((long)pvVar1 + 0x24) * (long)p->nFrames] = pAVar6;
      lVar15 = lVar15 + 1;
      pAVar5 = p->pAig;
    } while (lVar15 < pAVar5->nTruePis);
  }
  pAVar5 = p->pAig;
  if (0 < pAVar5->nRegs) {
    iVar14 = 0;
    do {
      uVar12 = pAVar5->nTruePis + iVar14;
      if (((int)uVar12 < 0) || (pAVar5->vCis->nSize <= (int)uVar12)) goto LAB_006a7abf;
      pvVar1 = pAVar5->vCis->pArray[uVar12];
      if (pAVar5->pReprs == (Aig_Obj_t **)0x0) {
        pAVar6 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar6 = pAVar5->pReprs[*(int *)((long)pvVar1 + 0x24)];
      }
      if (pAVar6 == (Aig_Obj_t *)0x0) {
        pAVar6 = Aig_ObjCreateCi(p->pFrames);
        (pAVar6->field_5).pData = pvVar1;
      }
      else {
        pAVar6 = (Aig_Obj_t *)
                 ((ulong)((*(uint *)((long)pvVar1 + 0x18) ^ *(uint *)&pAVar6->field_0x18) >> 3 & 1)
                 ^ (ulong)p->pNodeToFrames[(long)pAVar6->Id * (long)p->nFrames]);
      }
      p->pNodeToFrames[(long)*(int *)((long)pvVar1 + 0x24) * (long)p->nFrames] = pAVar6;
      iVar14 = iVar14 + 1;
      pAVar5 = p->pAig;
    } while (iVar14 < pAVar5->nRegs);
  }
  Aig_ManSetCioIds(p->pFrames);
  if (p->vSimInfo != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vSimInfo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswLcorr.c"
                  ,0x10c,"int Ssw_ManSweepLatch(Ssw_Man_t *)");
  }
  iVar14 = p->pFrames->nObjs[2];
  lVar15 = (long)iVar14;
  ppvVar7 = (void **)malloc(lVar15 * 0xc);
  if (0 < lVar15) {
    ppvVar8 = ppvVar7 + lVar15;
    ppvVar13 = ppvVar7;
    do {
      *ppvVar13 = ppvVar8;
      ppvVar13 = ppvVar13 + 1;
      ppvVar8 = (void **)((long)ppvVar8 + 4);
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nSize = iVar14;
  pVVar9->nCap = iVar14;
  pVVar9->pArray = ppvVar7;
  p->vSimInfo = pVVar9;
  if (0 < iVar14) {
    lVar15 = 0;
    do {
      *(undefined4 *)pVVar9->pArray[lVar15] = 0;
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar9->nSize);
  }
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar9->pArray = ppvVar7;
  iVar14 = 0;
  p->fRefined = 0;
  p->nCallsSat = 0;
  p->nCallsUnsat = 0;
  p->nCallsCount = 0;
  pAVar5 = p->pAig;
  if (0 < pAVar5->nRegs) {
    do {
      uVar12 = pAVar5->nTruePis + iVar14;
      if (((int)uVar12 < 0) || (pAVar5->vCis->nSize <= (int)uVar12)) {
LAB_006a7abf:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar6 = (Aig_Obj_t *)pAVar5->vCis->pArray[uVar12];
      if (pAVar5->pReprs == (Aig_Obj_t **)0x0) {
        pAVar10 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar10 = pAVar5->pReprs[pAVar6->Id];
      }
      if (pAVar10 == pAVar5->pConst1) {
        Ssw_ManSweepLatchOne(p,pAVar5->pConst1,pAVar6);
LAB_006a7a11:
        if (p->nPatterns == 0x20) {
          Ssw_ManSweepResimulate(p);
        }
        iVar4 = p->pPars->nSatVarMax;
        if (iVar4 != 0) {
          pSVar11 = p->pMSat;
          iVar3 = pSVar11->nSatVars;
          if ((iVar4 < iVar3) && (p->pPars->nRecycleCalls < p->nRecycleCalls)) {
            if (iVar3 < p->nVarsMax) {
              iVar3 = p->nVarsMax;
            }
            p->nVarsMax = iVar3;
            iVar4 = pSVar11->nSolverCalls;
            if (pSVar11->nSolverCalls < p->nCallsMax) {
              iVar4 = p->nCallsMax;
            }
            p->nCallsMax = iVar4;
            Ssw_SatStop(pSVar11);
            pSVar11 = Ssw_SatStart(0);
            p->pMSat = pSVar11;
            p->nRecycles = p->nRecycles + 1;
            p->nRecycleCalls = 0;
          }
        }
      }
      else {
        Ssw_ClassesCollectClass(p->ppClasses,pAVar6,pVVar9);
        if (pVVar9->nSize != 0) {
          if (0 < pVVar9->nSize) {
            lVar15 = 0;
            do {
              ppAVar2 = p->pAig->pReprs;
              if (ppAVar2 == (Aig_Obj_t **)0x0) {
                pAVar10 = (Aig_Obj_t *)0x0;
              }
              else {
                pAVar10 = ppAVar2[((Aig_Obj_t *)pVVar9->pArray[lVar15])->Id];
              }
            } while (((pAVar10 != pAVar6) ||
                     (Ssw_ManSweepLatchOne(p,pAVar6,(Aig_Obj_t *)pVVar9->pArray[lVar15]),
                     p->nPatterns != 0x20)) && (lVar15 = lVar15 + 1, lVar15 < pVVar9->nSize));
          }
          goto LAB_006a7a11;
        }
      }
      iVar14 = iVar14 + 1;
      pAVar5 = p->pAig;
    } while (iVar14 < pAVar5->nRegs);
  }
  if (0 < p->nPatterns) {
    Ssw_ManSweepResimulate(p);
  }
  if (pVVar9->pArray != (void **)0x0) {
    free(pVVar9->pArray);
    pVVar9->pArray = (void **)0x0;
  }
  free(pVVar9);
  return p->fRefined;
}

Assistant:

int Ssw_ManSweepLatch( Ssw_Man_t * p )
{
//    Bar_Progress_t * pProgress = NULL;
    Vec_Ptr_t * vClass;
    Aig_Obj_t * pObj, * pRepr, * pTemp;
    int i, k;

    // start the timeframe
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) );
    // map constants and PIs
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), 0, Aig_ManConst1(p->pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ObjCreateCi(p->pFrames) );

    // implement equivalence classes
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        pRepr = Aig_ObjRepr( p->pAig, pObj );
        if ( pRepr == NULL )
        {
            pTemp = Aig_ObjCreateCi(p->pFrames);
            pTemp->pData = pObj;
        }
        else
            pTemp = Aig_NotCond( Ssw_ObjFrame(p, pRepr, 0), pRepr->fPhase ^ pObj->fPhase );
        Ssw_ObjSetFrame( p, pObj, 0, pTemp );
    }
    Aig_ManSetCioIds( p->pFrames );

    // prepare simulation info
    assert( p->vSimInfo == NULL );
    p->vSimInfo = Vec_PtrAllocSimInfo( Aig_ManCiNum(p->pFrames), 1 );
    Vec_PtrCleanSimInfo( p->vSimInfo, 0, 1 );

    // go through the registers
//    if ( p->pPars->fVerbose )
//        pProgress = Bar_ProgressStart( stdout, Aig_ManRegNum(p->pAig) );
    vClass = Vec_PtrAlloc( 100 );
    p->fRefined = 0;
    p->nCallsCount = p->nCallsSat = p->nCallsUnsat = 0;
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
//        if ( p->pPars->fVerbose )
//            Bar_ProgressUpdate( pProgress, i, NULL );
        // consider the case of constant candidate
        if ( Ssw_ObjIsConst1Cand( p->pAig, pObj ) )
            Ssw_ManSweepLatchOne( p, Aig_ManConst1(p->pAig), pObj );
        else
        {
            // consider the case of equivalence class
            Ssw_ClassesCollectClass( p->ppClasses, pObj, vClass );
            if ( Vec_PtrSize(vClass) == 0 )
                continue;
            // try to prove equivalences in this class
            Vec_PtrForEachEntry( Aig_Obj_t *, vClass, pTemp, k )
                if ( Aig_ObjRepr(p->pAig, pTemp) == pObj )
                {
                    Ssw_ManSweepLatchOne( p, pObj, pTemp );
                    if ( p->nPatterns == 32 )
                        break;
                }
        }
        // resimulate
        if ( p->nPatterns == 32 )
            Ssw_ManSweepResimulate( p );
        // attempt recycling the SAT solver
        if ( p->pPars->nSatVarMax &&
             p->pMSat->nSatVars > p->pPars->nSatVarMax &&
             p->nRecycleCalls > p->pPars->nRecycleCalls )
        {
            p->nVarsMax  = Abc_MaxInt( p->nVarsMax,  p->pMSat->nSatVars );
            p->nCallsMax = Abc_MaxInt( p->nCallsMax, p->pMSat->nSolverCalls );
            Ssw_SatStop( p->pMSat );
            p->pMSat = Ssw_SatStart( 0 );
            p->nRecycles++;
            p->nRecycleCalls = 0;
        }
    }
//    ABC_PRT( "reduce", p->timeReduce );
//    Aig_TableProfile( p->pFrames );
//    Abc_Print( 1, "And gates = %d\n", Aig_ManNodeNum(p->pFrames) );
    // resimulate
    if ( p->nPatterns > 0 )
        Ssw_ManSweepResimulate( p );
    // cleanup
    Vec_PtrFree( vClass );
//    if ( p->pPars->fVerbose )
//        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
    return p->fRefined;
}